

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

hwaddr mips_cpu_get_phys_page_debug_mips64(CPUState *cs,vaddr addr)

{
  int iVar1;
  CPUMIPSState_conflict5 *env_00;
  int local_3c;
  CPUState *pCStack_38;
  int prot;
  hwaddr phys_addr;
  CPUMIPSState_conflict5 *env;
  MIPSCPU_conflict2 *cpu;
  vaddr addr_local;
  CPUState *cs_local;
  
  env_00 = (CPUMIPSState_conflict5 *)(cs[1].tb_jmp_cache + 0x143);
  phys_addr = (hwaddr)env_00;
  env = (CPUMIPSState_conflict5 *)cs;
  cpu = (MIPSCPU_conflict2 *)addr;
  addr_local = (vaddr)cs;
  iVar1 = cpu_mmu_index(env_00,false);
  iVar1 = get_physical_address
                    (env_00,(hwaddr *)&stack0xffffffffffffffc8,&local_3c,addr,0,0x20,iVar1);
  if (iVar1 == 0) {
    cs_local = pCStack_38;
  }
  else {
    cs_local = (CPUState *)0xffffffffffffffff;
  }
  return (hwaddr)cs_local;
}

Assistant:

hwaddr mips_cpu_get_phys_page_debug(CPUState *cs, vaddr addr)
{
    MIPSCPU *cpu = MIPS_CPU(cs);
    CPUMIPSState *env = &cpu->env;
    hwaddr phys_addr;
    int prot;

    if (get_physical_address(env, &phys_addr, &prot, addr, 0, ACCESS_INT,
                             cpu_mmu_index(env, false)) != 0) {
        return -1;
    }
    return phys_addr;
}